

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

PHYSFS_Io * zip_get_io(PHYSFS_Io *io,ZIPinfo *inf,ZIPentry *entry)

{
  int iVar1;
  PHYSFS_uint64 local_50;
  bool local_41;
  PHYSFS_sint64 offset;
  PHYSFS_Io *retval;
  int success;
  ZIPentry *entry_local;
  ZIPinfo *inf_local;
  PHYSFS_Io *io_local;
  
  offset = (PHYSFS_sint64)(*io->duplicate)(io);
  if ((PHYSFS_Io *)offset == (PHYSFS_Io *)0x0) {
    io_local = (PHYSFS_Io *)0x0;
  }
  else {
    if ((entry->tree).isdir != 0) {
      __assert_fail("!entry->tree.isdir",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_zip.c"
                    ,0x5e6,"PHYSFS_Io *zip_get_io(PHYSFS_Io *, ZIPinfo *, ZIPentry *)");
    }
    local_41 = true;
    if (inf != (ZIPinfo *)0x0) {
      iVar1 = zip_resolve((PHYSFS_Io *)offset,inf,entry);
      local_41 = iVar1 != 0;
    }
    retval._4_4_ = (uint)local_41;
    if (retval._4_4_ != 0) {
      if (entry->symlink == (_ZIPentry *)0x0) {
        local_50 = entry->offset;
      }
      else {
        local_50 = entry->symlink->offset;
      }
      retval._4_4_ = (*((PHYSFS_Io *)offset)->seek)((PHYSFS_Io *)offset,local_50);
    }
    if (retval._4_4_ == 0) {
      (*((PHYSFS_Io *)offset)->destroy)((PHYSFS_Io *)offset);
      offset = 0;
    }
    io_local = (PHYSFS_Io *)offset;
  }
  return io_local;
}

Assistant:

static PHYSFS_Io *zip_get_io(PHYSFS_Io *io, ZIPinfo *inf, ZIPentry *entry)
{
    int success;
    PHYSFS_Io *retval = io->duplicate(io);
    BAIL_IF_ERRPASS(!retval, NULL);

    assert(!entry->tree.isdir); /* should have been checked before calling. */

    /* (inf) can be NULL if we already resolved. */
    success = (inf == NULL) || zip_resolve(retval, inf, entry);
    if (success)
    {
        PHYSFS_sint64 offset;
        offset = ((entry->symlink) ? entry->symlink->offset : entry->offset);
        success = retval->seek(retval, offset);
    } /* if */

    if (!success)
    {
        retval->destroy(retval);
        retval = NULL;
    } /* if */

    return retval;
}